

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::GenerateMergingCode
          (WrapperFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  WrapperFieldGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                     "if (other.$has_property_check$) {\n  if ($has_not_property_check$ || other.$property_name$ != $default_value$) {\n    $property_name$ = other.$property_name$;\n  }\n}\n"
                    );
  return;
}

Assistant:

void WrapperFieldGenerator::GenerateMergingCode(io::Printer* printer) {
  printer->Print(
    variables_,
    "if (other.$has_property_check$) {\n"
    "  if ($has_not_property_check$ || other.$property_name$ != $default_value$) {\n"
    "    $property_name$ = other.$property_name$;\n"
    "  }\n"
    "}\n");
}